

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::detail::Dispatch_Engine::call_exists(Dispatch_Engine *this,Function_Params *params)

{
  bool b;
  arity_error *this_00;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Boxed_Value BVar2;
  Type_Conversions_State convs;
  long *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  Type_Conversions_State local_50;
  long local_40;
  long local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  if ((Boxed_Value *)*in_RDX != (Boxed_Value *)in_RDX[1]) {
    local_50.m_conversions._M_data = (Type_Conversions *)&params->m_end;
    local_50.m_saves._M_data = (Conversion_Saves *)&params[10].m_end;
    boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
              ((chaiscript *)&local_60,(Boxed_Value *)*in_RDX,&local_50);
    local_38 = in_RDX[1];
    local_40 = *in_RDX + 0x10;
    local_50.m_conversions._M_data = (Type_Conversions *)&params->m_end;
    local_50.m_saves._M_data = (Conversion_Saves *)&params[10].m_end;
    b = (bool)(**(code **)(*local_60 + 0x18))(local_60,&local_40,&local_50);
    BVar2 = const_var((chaiscript *)this,b);
    _Var1._M_pi = BVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      _Var1._M_pi = extraout_RDX;
    }
    BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var1._M_pi;
    BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Boxed_Value)
           BVar2.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (arity_error *)__cxa_allocate_exception(0x18);
  chaiscript::exception::arity_error::arity_error
            (this_00,(int)((ulong)(in_RDX[1] - *in_RDX) >> 4),1);
  __cxa_throw(this_00,&chaiscript::exception::arity_error::typeinfo,std::range_error::~range_error);
}

Assistant:

Boxed_Value call_exists(const Function_Params &params) const {
        if (params.empty()) {
          throw chaiscript::exception::arity_error(static_cast<int>(params.size()), 1);
        }

        const auto &f = this->boxed_cast<Const_Proxy_Function>(params[0]);
        const Type_Conversions_State convs(m_conversions, m_conversions.conversion_saves());

        return const_var(f->call_match(Function_Params(params.begin() + 1, params.end()), convs));
      }